

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsondocument.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *stream,QJsonDocument *doc)

{
  long lVar1;
  bool bVar2;
  QDataStream *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  QJsonParseError parseError;
  QByteArray buffer;
  QJsonDocument *in_stack_ffffffffffffff88;
  QJsonDocument *in_stack_ffffffffffffff90;
  QByteArray *in_stack_ffffffffffffffb0;
  int iVar3;
  QByteArray *json;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  json = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)0x48f96a);
  operator>>(in_RSI,in_stack_ffffffffffffffb0);
  iVar3 = 0;
  QJsonDocument::fromJson(json,(QJsonParseError *)0xffffffff);
  QJsonDocument::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  QJsonDocument::~QJsonDocument((QJsonDocument *)0x48f9c9);
  if (iVar3 != 0) {
    bVar2 = QByteArray::isEmpty((QByteArray *)0x48f9da);
    if (!bVar2) {
      QDataStream::setStatus(in_RDI,ReadCorruptData);
    }
  }
  QByteArray::~QByteArray((QByteArray *)0x48fa23);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &stream, QJsonDocument &doc)
{
    QByteArray buffer;
    stream >> buffer;
    QJsonParseError parseError{};
    doc = QJsonDocument::fromJson(buffer, &parseError);
    if (parseError.error && !buffer.isEmpty())
        stream.setStatus(QDataStream::ReadCorruptData);
    return stream;
}